

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void translateColumnToCopy(Parse *pParse,int iStart,int iTabCur,int iRegister,int bIncrRowid)

{
  Vdbe *pVVar1;
  int iVar2;
  Op *pOVar3;
  int *piVar4;
  
  pVVar1 = pParse->pVdbe;
  iVar2 = iStart;
  if (iStart < 0) {
    iVar2 = pVVar1->nOp + -1;
  }
  if (pVVar1->db->mallocFailed == '\0') {
    pOVar3 = pVVar1->aOp + iVar2;
  }
  else {
    pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  iVar2 = pVVar1->nOp - iStart;
  if ((iVar2 != 0 && iStart <= pVVar1->nOp) && pParse->db->mallocFailed == '\0') {
    piVar4 = &pOVar3->p3;
    do {
      if (piVar4[-2] == iTabCur) {
        if (((Op *)(piVar4 + -3))->opcode == 0x80) {
          if (bIncrRowid == 0) {
            ((Op *)(piVar4 + -3))->opcode = 'I';
            piVar4[-2] = 0;
            *piVar4 = 0;
          }
          else {
            ((Op *)(piVar4 + -3))->opcode = 'S';
            piVar4[-2] = piVar4[-1];
            piVar4[-1] = 1;
          }
        }
        else if (((Op *)(piVar4 + -3))->opcode == 'Z') {
          ((Op *)(piVar4 + -3))->opcode = 'N';
          piVar4[-2] = piVar4[-1] + iRegister;
          piVar4[-1] = *piVar4;
          *piVar4 = 0;
        }
      }
      piVar4 = piVar4 + 6;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

static void translateColumnToCopy(
  Parse *pParse,      /* Parsing context */
  int iStart,         /* Translate from this opcode to the end */
  int iTabCur,        /* OP_Column/OP_Rowid references to this table */
  int iRegister,      /* The first column is in this register */
  int bIncrRowid      /* If non-zero, transform OP_rowid to OP_AddImm(1) */
){
  Vdbe *v = pParse->pVdbe;
  VdbeOp *pOp = sqlite3VdbeGetOp(v, iStart);
  int iEnd = sqlite3VdbeCurrentAddr(v);
  if( pParse->db->mallocFailed ) return;
  for(; iStart<iEnd; iStart++, pOp++){
    if( pOp->p1!=iTabCur ) continue;
    if( pOp->opcode==OP_Column ){
      pOp->opcode = OP_Copy;
      pOp->p1 = pOp->p2 + iRegister;
      pOp->p2 = pOp->p3;
      pOp->p3 = 0;
    }else if( pOp->opcode==OP_Rowid ){
      if( bIncrRowid ){
        /* Increment the value stored in the P2 operand of the OP_Rowid. */
        pOp->opcode = OP_AddImm;
        pOp->p1 = pOp->p2;
        pOp->p2 = 1;
      }else{
        pOp->opcode = OP_Null;
        pOp->p1 = 0;
        pOp->p3 = 0;
      }
    }
  }
}